

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_method_set_home_object(JSContext *ctx,JSValue func_obj,JSValue home_obj)

{
  JSValue v;
  BOOL BVar1;
  JSValueUnion in_RCX;
  int in_EDX;
  long in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  JSValue JVar2;
  JSFunctionBytecode *b;
  JSObject *p1;
  JSObject *p;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion local_38;
  
  if (((in_EDX == -1) && (BVar1 = js_class_has_bytecode((uint)*(ushort *)(in_RSI + 6)), BVar1 != 0))
     && ((*(ushort *)(*(long *)(in_RSI + 0x30) + 0x19) >> 3 & 1) != 0)) {
    if (*(long *)(in_RSI + 0x40) != 0) {
      JVar2.tag = *(long *)(in_RSI + 0x40);
      JVar2.u.float64 = in_stack_ffffffffffffffa8.float64;
      JS_FreeValue(in_stack_ffffffffffffffa0,JVar2);
    }
    if ((int)in_R8 == -1) {
      v.tag = in_R8;
      v.u.float64 = in_RCX.float64;
      JVar2 = JS_DupValue(in_RDI,v);
      local_38 = JVar2.u;
    }
    else {
      local_38.float64 = 0.0;
    }
    *(JSValueUnion *)(in_RSI + 0x40) = local_38;
  }
  return;
}

Assistant:

static void js_method_set_home_object(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst home_obj)
{
    JSObject *p, *p1;
    JSFunctionBytecode *b;

    if (JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT)
        return;
    p = JS_VALUE_GET_OBJ(func_obj);
    if (!js_class_has_bytecode(p->class_id))
        return;
    b = p->u.func.function_bytecode;
    if (b->need_home_object) {
        p1 = p->u.func.home_object;
        if (p1) {
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
        }
        if (JS_VALUE_GET_TAG(home_obj) == JS_TAG_OBJECT)
            p1 = JS_VALUE_GET_OBJ(JS_DupValue(ctx, home_obj));
        else
            p1 = NULL;
        p->u.func.home_object = p1;
    }
}